

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

boolean attacks(int adtyp,obj *otmp,obj *olaunch,boolean thrown)

{
  boolean bVar1;
  artifact *local_38;
  artifact *weap;
  boolean thrown_local;
  obj *olaunch_local;
  obj *otmp_local;
  int adtyp_local;
  
  if ((otmp == (obj *)0x0) || (otmp->oartifact == '\0')) {
    local_38 = (artifact *)0x0;
  }
  else {
    local_38 = artilist + (int)otmp->oartifact;
  }
  if (local_38 != (artifact *)0x0) {
    return (uint)(local_38->attk).adtyp == adtyp;
  }
  if ((otmp->oprops != 0) ||
     (((((otmp->oclass == '\x02' || (otmp->oclass == '\r')) &&
        (-0x19 < objects[otmp->otyp].oc_subtyp)) &&
       ((objects[otmp->otyp].oc_subtyp < -0x15 && (olaunch != (obj *)0x0)))) &&
      (((int)objects[otmp->otyp].oc_subtyp == -(int)objects[olaunch->otyp].oc_subtyp &&
       (olaunch->oprops != 0)))))) {
    if ((adtyp == 2) && (bVar1 = oprop_attack(1,otmp,olaunch,thrown), bVar1 != '\0')) {
      return '\x01';
    }
    if ((adtyp == 3) && (bVar1 = oprop_attack(2,otmp,olaunch,thrown), bVar1 != '\0')) {
      return '\x01';
    }
    if ((adtyp == 0xf) && (bVar1 = oprop_attack(4,otmp,olaunch,thrown), bVar1 != '\0')) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

static boolean attacks(int adtyp, struct obj *otmp, struct obj *olaunch,
		       boolean thrown)
{
	const struct artifact *weap;

	if ((weap = get_artifact(otmp)) != 0)
		return (boolean)(weap->attk.adtyp == adtyp);

	if (!weap && (otmp->oprops ||
		      (ammo_and_launcher(otmp, olaunch) &&
		       olaunch->oprops))) {
	    if (adtyp == AD_FIRE &&
		oprop_attack(ITEM_FIRE, otmp, olaunch, thrown))
		return TRUE;
	    if (adtyp == AD_COLD &&
		oprop_attack(ITEM_FROST, otmp, olaunch, thrown))
		return TRUE;
	    if (adtyp == AD_DRLI &&
		oprop_attack(ITEM_DRLI, otmp, olaunch, thrown))
		return TRUE;
	}

	return FALSE;
}